

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void SendSetup(DWORD *playersdetected,BYTE *gotsetup,int len)

{
  int len_00;
  long lVar1;
  
  if (consoleplayer == Net_Arbitrator) {
    if (1 < doomcom.numnodes) {
      lVar1 = 1;
      do {
        if ((gotsetup[lVar1] == '\0') || (doomcom.data[0] == '#')) {
          HSendPacket((int)lVar1,len);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < doomcom.numnodes);
    }
    return;
  }
  len_00 = 10;
  if ((playersdetected[1] >> (consoleplayer & 0x1fU) & 1) == 0) {
    len_00 = len;
  }
  HSendPacket(1,len_00);
  return;
}

Assistant:

static void SendSetup (DWORD playersdetected[MAXNETNODES], BYTE gotsetup[MAXNETNODES], int len)
{
	if (consoleplayer != Net_Arbitrator)
	{
		if (playersdetected[1] & (1 << consoleplayer))
		{
			HSendPacket (1, 10);
		}
		else
		{
			HSendPacket (1, len);
		}
	}
	else
	{
		for (int i = 1; i < doomcom.numnodes; ++i)
		{
			if (!gotsetup[i] || netbuffer[0] == NCMD_SETUP+3)
			{
				HSendPacket (i, len);
			}
		}
	}
}